

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

uint dictionary_hash(char *key)

{
  uint uVar1;
  size_t sVar2;
  ulong local_30;
  size_t i;
  uint hash;
  size_t len;
  char *key_local;
  
  if (key == (char *)0x0) {
    key_local._4_4_ = 0;
  }
  else {
    sVar2 = strlen(key);
    i._4_4_ = 0;
    for (local_30 = 0; local_30 < sVar2; local_30 = local_30 + 1) {
      uVar1 = ((int)key[local_30] + i._4_4_) * 0x401;
      i._4_4_ = uVar1 >> 6 ^ uVar1;
    }
    key_local._4_4_ = (i._4_4_ * 9 >> 0xb ^ i._4_4_ * 9) * 0x8001;
  }
  return key_local._4_4_;
}

Assistant:

unsigned dictionary_hash(const char * key)
{
    size_t      len ;
    unsigned    hash ;
    size_t      i ;

    if (!key)
        return 0 ;

    len = strlen(key);
    for (hash=0, i=0 ; i<len ; i++) {
        hash += (unsigned)key[i] ;
        hash += (hash<<10);
        hash ^= (hash>>6) ;
    }
    hash += (hash <<3);
    hash ^= (hash >>11);
    hash += (hash <<15);
    return hash ;
}